

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrNtbdd.c
# Opt level: O0

void Aig_ManFreeGlobalBdds(Aig_Man_t *p,DdManager *dd)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  DdNode *pDVar2;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  DdManager *dd_local;
  Aig_Man_t *p_local;
  
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if ((pObj_00 != (Aig_Obj_t *)0x0) &&
       (pDVar2 = Aig_ObjGlobalBdd(pObj_00), pDVar2 != (DdNode *)0x0)) {
      Aig_ObjCleanGlobalBdd(dd,pObj_00);
    }
  }
  return;
}

Assistant:

void Aig_ManFreeGlobalBdds( Aig_Man_t * p, DdManager * dd ) 
{ 
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachObj( p, pObj, i )
        if ( Aig_ObjGlobalBdd(pObj) )
            Aig_ObjCleanGlobalBdd( dd, pObj );
}